

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O0

void __thiscall Interpreter::Interpreter(Interpreter *this,ifstream *s)

{
  void *pvVar1;
  mapped_type *pmVar2;
  ifstream *s_local;
  Interpreter *this_local;
  
  std::
  map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
  ::map(&this->operations);
  this->currentOp = 0;
  this->stackPos = 0;
  std::vector<Interpreter::Call,_std::allocator<Interpreter::Call>_>::vector(&this->callList);
  this->s = s;
  pvVar1 = malloc(0x1000);
  this->stack = pvVar1;
  pvVar1 = malloc(0x1000);
  this->res = pvVar1;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::POP);
  *pmVar2 = (mapped_type)pop;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::PUSH);
  *pmVar2 = (mapped_type)push;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::ADD);
  *pmVar2 = (mapped_type)add;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::SUB);
  *pmVar2 = (mapped_type)sub;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::MUL);
  *pmVar2 = (mapped_type)mul;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::DIV);
  *pmVar2 = (mapped_type)div;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::PRINT);
  *pmVar2 = (mapped_type)print;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::LESS);
  *pmVar2 = (mapped_type)less;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::LESS_EQUAL);
  *pmVar2 = (mapped_type)less_equal;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::EQUAL);
  *pmVar2 = (mapped_type)equal;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::GREATER_EQUAL);
  *pmVar2 = (mapped_type)greater_equal;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::GREATER);
  *pmVar2 = (mapped_type)greater;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::GOTO);
  *pmVar2 = (mapped_type)_goto;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::IF);
  *pmVar2 = (mapped_type)_if;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::INCR);
  *pmVar2 = (mapped_type)incr;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::DECR);
  *pmVar2 = (mapped_type)decr;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::MOV);
  *pmVar2 = (mapped_type)mov;
  pmVar2[1] = 0;
  pmVar2 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](&this->operations,&op::ASSIGN);
  *pmVar2 = (mapped_type)assign;
  pmVar2[1] = 0;
  return;
}

Assistant:

Interpreter::Interpreter(std::ifstream &s) {
    this->s = &s;
    stack = malloc(STACK_SIZE);
    res = malloc(RES_SIZE);

    operations[op::POP] = &Interpreter::pop;
    operations[op::PUSH] = &Interpreter::push;
    operations[op::ADD] = (void (Interpreter::*)(void *)) &Interpreter::add;
    operations[op::SUB] = (void (Interpreter::*)(void *)) &Interpreter::sub;
    operations[op::MUL] = (void (Interpreter::*)(void *)) &Interpreter::mul;
    operations[op::DIV] = (void (Interpreter::*)(void *)) &Interpreter::div;
    operations[op::PRINT] = (void (Interpreter::*)(void *)) &Interpreter::print;
    operations[op::LESS] = (void (Interpreter::*)(void *)) &Interpreter::less;
    operations[op::LESS_EQUAL] = (void (Interpreter::*)(void *)) &Interpreter::less_equal;
    operations[op::EQUAL] = (void (Interpreter::*)(void *)) &Interpreter::equal;
    operations[op::GREATER_EQUAL] = (void (Interpreter::*)(void *)) &Interpreter::greater_equal;
    operations[op::GREATER] = (void (Interpreter::*)(void *)) &Interpreter::greater;
    operations[op::GOTO] = &Interpreter::_goto;
    operations[op::IF] = (void (Interpreter::*)(void *)) &Interpreter::_if;
    operations[op::INCR] = (void (Interpreter::*)(void *)) &Interpreter::incr;
    operations[op::DECR] = (void (Interpreter::*)(void *)) &Interpreter::decr;
    operations[op::MOV] = &Interpreter::mov;
//    operations[op::VAR] = &Interpreter::var;
    operations[op::ASSIGN] = &Interpreter::assign;
}